

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat format,IVec2 *size,deUint32 numLayers,
          VkSampleCountFlagBits samples,VkImageUsageFlags usage)

{
  deUint32 width;
  deUint32 height;
  VkExtent3D VVar1;
  VkImageType local_a0;
  VkFormat VStack_9c;
  deUint32 local_98;
  undefined1 local_90 [8];
  VkImageCreateInfo imageParams;
  deUint32 numLayers_local;
  IVec2 *size_local;
  VkFormat format_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  local_90._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext._0_4_ = 0;
  imageParams.pNext._4_4_ = 1;
  imageParams.flags = format;
  imageParams._84_4_ = numLayers;
  width = tcu::Vector<int,_2>::x(size);
  height = tcu::Vector<int,_2>::y(size);
  VVar1 = ::vk::makeExtent3D(width,height,1);
  _local_a0 = VVar1._0_8_;
  imageParams.imageType = local_a0;
  imageParams.format = VStack_9c;
  local_98 = VVar1.depth;
  imageParams.extent.width = local_98;
  imageParams.extent.height = 1;
  imageParams.extent.depth = imageParams._84_4_;
  imageParams.mipLevels = samples;
  imageParams.arrayLayers = 0;
  imageParams.samples = usage;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(__return_storage_ptr__,vk,device,(VkImageCreateInfo *)local_90,
                    (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface& vk, const VkDevice device, const VkFormat format, const IVec2& size, const deUint32 numLayers, const VkSampleCountFlagBits samples, const VkImageUsageFlags usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageCreateFlags)0,							// VkImageCreateFlags		flags;
		VK_IMAGE_TYPE_2D,								// VkImageType				imageType;
		format,											// VkFormat					format;
		makeExtent3D(size.x(), size.y(), 1),			// VkExtent3D				extent;
		1u,												// deUint32					mipLevels;
		numLayers,										// deUint32					arrayLayers;
		samples,										// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,						// VkImageTiling			tiling;
		usage,											// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,						// VkSharingMode			sharingMode;
		0u,												// deUint32					queueFamilyIndexCount;
		DE_NULL,										// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			initialLayout;
	};
	return createImage(vk, device, &imageParams);
}